

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wining-state.cpp
# Opt level: O3

void __thiscall
mahjong::WiningState::winByDiscard(WiningState *this,WinByDiscardSituation situation)

{
  bool bVar1;
  bool bVar2;
  
  this->is_win_by_discard = true;
  this->is_one_shot = (bool)(situation.is_one_shot & 1);
  bVar1 = (bool)(situation.is_last_discard & 1);
  this->is_last_discard = bVar1;
  bVar2 = (bool)(situation.is_robbing_quad & 1);
  this->is_robbing_quad = bVar2;
  if (((bVar1 & bVar2) == 0) && (((uint3)situation >> 8 & (uint3)situation & 1) == 0)) {
    return;
  }
  __assert_fail("!(is_last_discard && is_robbing_quad) && !(is_last_discard && is_one_shot)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/src/wining-state.cpp"
                ,0x16,"void mahjong::WiningState::winByDiscard(WinByDiscardSituation)");
}

Assistant:

void WiningState::winByDiscard(WinByDiscardSituation situation)
{
	is_win_by_discard = true;

	is_one_shot = situation.is_one_shot;
	is_last_discard = situation.is_last_discard;
	is_robbing_quad = situation.is_robbing_quad;
	assert(
		!(is_last_discard && is_robbing_quad) &&
		!(is_last_discard && is_one_shot)
	);
}